

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  uint imm;
  uint Rd;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  imm = 3;
  _Rd = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,8,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0xc,3);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,0x1a,1);
  uVar6 = MCInst_getOpcode(pMStack_18);
  if (uVar6 == 0x988) {
    DVar7 = DecoderGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rd);
    _Var1 = Check(&imm,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar7 = DecoderGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rd);
  _Var1 = Check(&imm,DVar7);
  if (_Var1) {
    MCOperand_CreateImm0(pMStack_18,(ulong)(uVar5 << 0xb | uVar4 << 0xc | uVar3 << 8 | uVar2));
    Inst_local._4_4_ = imm;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 8) << 0);
	imm |= (fieldFromInstruction_4(Insn, 12, 3) << 8);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);
	imm |= (fieldFromInstruction_4(Insn, 26, 1) << 11);

	if (MCInst_getOpcode(Inst) == ARM_t2MOVTi16)
		if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}